

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# siphash_prov.c
# Opt level: O0

int siphash_init(void *vmacctx,uchar *key,size_t keylen,OSSL_PARAM *params)

{
  int iVar1;
  size_t in_RCX;
  OSSL_PARAM *in_RDX;
  siphash_data_st *in_RSI;
  siphash_data_st *ctx;
  
  iVar1 = ossl_prov_is_running();
  if ((iVar1 != 0) && (iVar1 = siphash_set_params(in_RSI,in_RDX), iVar1 != 0)) {
    if (in_RSI == (siphash_data_st *)0x0) {
      return 1;
    }
    iVar1 = siphash_setkey(in_RSI,(uchar *)in_RDX,in_RCX);
    return iVar1;
  }
  return 0;
}

Assistant:

static int siphash_init(void *vmacctx, const unsigned char *key, size_t keylen,
                        const OSSL_PARAM params[])
{
    struct siphash_data_st *ctx = vmacctx;

    if (!ossl_prov_is_running() || !siphash_set_params(ctx, params))
        return 0;
    /* Without a key, there is not much to do here,
     * The actual initialization happens through controls.
     */
    if (key == NULL)
        return 1;
    return siphash_setkey(ctx, key, keylen);
}